

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int thrd_sleep(timespec *time_point,timespec *remaining)

{
  int iVar1;
  long local_38;
  long delta;
  timespec now;
  timespec *remaining_local;
  timespec *time_point_local;
  
  now.tv_nsec = (__syscall_slong_t)remaining;
  iVar1 = clock_gettime(0,(timespec *)&delta);
  if (iVar1 == 0) {
    for (local_38 = (time_point->tv_sec - delta) * 1000000 +
                    ((time_point->tv_nsec - now.tv_sec) + 500) / 1000; 999999 < local_38;
        local_38 = local_38 + -999999) {
      usleep(999999);
    }
    if (0 < local_38) {
      usleep((__useconds_t)local_38);
    }
    if (now.tv_nsec != 0) {
      *(undefined8 *)now.tv_nsec = 0;
      *(undefined8 *)(now.tv_nsec + 8) = 0;
    }
    time_point_local._4_4_ = 0;
  }
  else {
    time_point_local._4_4_ = -2;
  }
  return time_point_local._4_4_;
}

Assistant:

int thrd_sleep(const struct timespec *time_point, struct timespec *remaining)
{
  struct timespec now;
#if defined(_TTHREAD_WIN32_)
  DWORD delta;
#else
  long delta;
#endif

  /* Get the current time */
  if (clock_gettime(CLOCK_REALTIME, &now) != 0)
    return -2;  // FIXME: Some specific error code?

#if defined(_TTHREAD_WIN32_)
  /* Delta in milliseconds */
  delta = (DWORD) ((time_point->tv_sec - now.tv_sec) * 1000 +
                   (time_point->tv_nsec - now.tv_nsec + 500000) / 1000000);
  if (delta > 0)
  {
    Sleep(delta);
  }
#else
  /* Delta in microseconds */
  delta = (time_point->tv_sec - now.tv_sec) * 1000000L +
          (time_point->tv_nsec - now.tv_nsec + 500L) / 1000L;

  /* On some systems, the usleep argument must be < 1000000 */
  while (delta > 999999L)
  {
    usleep(999999);
    delta -= 999999L;
  }
  if (delta > 0L)
  {
    usleep((useconds_t)delta);
  }
#endif

  /* We don't support waking up prematurely (yet) */
  if (remaining)
  {
    remaining->tv_sec = 0;
    remaining->tv_nsec = 0;
  }
  return 0;
}